

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O3

void * __thiscall ObjectBlockPool<8,_8192>::Alloc(ObjectBlockPool<8,_8192> *this)

{
  FastVector<LargeBlock<8,_8192>_*,_false,_false> *this_00;
  LargeBlock<8,_8192> **ppLVar1;
  LargeBlock<8,_8192> *pLVar2;
  uint uVar3;
  MyLargeBlock *__s;
  MySmallBlock *pMVar4;
  ulong uVar5;
  uint uVar6;
  MyLargeBlock *tmp;
  MyLargeBlock *newPage;
  MyLargeBlock *local_20;
  
  pMVar4 = this->freeBlocks;
  if (pMVar4 == &this->lastBlock || pMVar4 == (MySmallBlock *)0x0) {
    uVar6 = this->lastNum;
    if (uVar6 == 0x2000) {
      __s = (MyLargeBlock *)NULLC::alignedAlloc(0x10010);
      local_20 = __s;
      memset(__s,0,0x10010);
      __s->next = this->activePages;
      this->activePages = __s;
      this->lastNum = 0;
      this_00 = &this->sortedPages;
      uVar6 = (this->sortedPages).count;
      if (uVar6 == (this->sortedPages).max) {
        FastVector<LargeBlock<8,_8192>_*,_false,_false>::grow_and_add(this_00,uVar6,&local_20);
        uVar3 = (this->sortedPages).count;
      }
      else {
        uVar3 = uVar6 + 1;
        (this->sortedPages).count = uVar3;
        (this->sortedPages).data[uVar6] = __s;
      }
      if (0 < (int)(uVar3 - 1)) {
        uVar5 = (ulong)uVar3 - 2;
        uVar6 = uVar3;
        do {
          uVar6 = uVar6 - 1;
          if ((uVar3 <= uVar6) || (uVar3 <= uVar5)) {
            __assert_fail("index < count",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x7f,
                          "T &FastVector<LargeBlock<8, 8192> *>::operator[](unsigned int) [T = LargeBlock<8, 8192> *, zeroNewMemory = false, skipConstructor = false]"
                         );
          }
          ppLVar1 = this_00->data;
          pLVar2 = ppLVar1[uVar6];
          if (ppLVar1[uVar5] <= pLVar2) break;
          ppLVar1[uVar6] = ppLVar1[uVar5];
          this_00->data[uVar5] = pLVar2;
          uVar5 = uVar5 - 1;
        } while (1 < (int)uVar6);
      }
      uVar6 = this->lastNum;
    }
    this->lastNum = uVar6 + 1;
    pMVar4 = this->activePages->page + uVar6;
  }
  else {
    this->freeBlocks =
         (MySmallBlock *)(((ulong)(NULLC::OBJECT_MASK - 1) | 0xfffffffffffffffc) & pMVar4->marker);
  }
  return pMVar4;
}

Assistant:

void* Alloc()
	{
		MySmallBlock*	result;
		if(freeBlocks && freeBlocks != &lastBlock)
		{
			result = freeBlocks;
			freeBlocks = (MySmallBlock*)((intptr_t)freeBlocks->next & ~NULLC::OBJECT_MASK);
		}else{
			if(lastNum == countInBlock)
			{
				MyLargeBlock* newPage = new(NULLC::alignedAlloc(sizeof(MyLargeBlock))) MyLargeBlock;
				memset(newPage, 0, sizeof(MyLargeBlock));
				newPage->next = activePages;
				activePages = newPage;
				lastNum = 0;
				sortedPages.push_back(newPage);
				int index = sortedPages.size() - 1;
				while(index > 0 && sortedPages[index] < sortedPages[index - 1])
				{
					MyLargeBlock *tmp = sortedPages[index];
					sortedPages[index] = sortedPages[index - 1];
					sortedPages[index - 1] = tmp;
					index--;
				}
			}
			result = &activePages->page[lastNum++];
		}
		return result;
	}